

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_suite.cpp
# Opt level: O3

void number_suite::test_double(void)

{
  type value;
  value_type input [9];
  iarchive in;
  double local_c8 [2];
  uchar local_b8 [16];
  iarchive local_a8;
  
  local_b8[0] = 0xd7;
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = 0xf0;
  local_b8[8] = '?';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[9]>(&local_a8,(uchar (*) [9])local_b8)
  ;
  local_c8[0] = 0.0;
  trial::protocol::bintoken::iarchive::load<double>(&local_a8,local_c8);
  local_c8[1] = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("value","1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_suite.cpp"
             ,0xbd,"void number_suite::test_double()",local_c8,local_c8 + 1);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_0013dfc8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_double()
{
    const value_type input[] = { token::code::float64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0x3F };
    format::iarchive in(input);
    token::float64::type value = 0.0;
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value, 1.0);
}